

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O1

int obudec_read_temporal_unit
              (ObuDecInputContext *obu_ctx,uint8_t **buffer,size_t *bytes_read,size_t *buffer_size)

{
  uint8_t **ppuVar1;
  AvxInputContext *pAVar2;
  size_t sVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  size_t sVar9;
  uint64_t *value;
  size_t *psVar10;
  ulong uVar11;
  undefined1 buffered;
  ulong buffer_capacity;
  size_t *psVar13;
  size_t bytes_read_1;
  size_t *local_98;
  size_t length_of_temporal_unit_size;
  size_t local_88;
  uint8_t **local_80;
  size_t local_78;
  size_t *local_70;
  size_t *local_68;
  uint8_t tuheader [8];
  uint64_t size;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  size_t *psVar12;
  
  pAVar2 = obu_ctx->avx_ctx;
  if (pAVar2->file == (FILE *)0x0) {
    return -1;
  }
  *buffer_size = 0;
  *bytes_read = 0;
  _Var5 = input_eof(pAVar2);
  iVar7 = 1;
  if (_Var5) {
    return 1;
  }
  length_of_temporal_unit_size = 0;
  tuheader[0] = '\0';
  tuheader[1] = '\0';
  tuheader[2] = '\0';
  tuheader[3] = '\0';
  tuheader[4] = '\0';
  tuheader[5] = '\0';
  tuheader[6] = '\0';
  tuheader[7] = '\0';
  local_80 = buffer;
  local_70 = bytes_read;
  local_68 = buffer_size;
  if (obu_ctx->is_annexb == 0) {
    ppuVar1 = &obu_ctx->buffer;
    psVar13 = &obu_ctx->buffer_capacity;
    sVar9 = 0;
    do {
      local_48._0_4_ = 0;
      local_48._4_4_ = 0;
      uStack_40._0_4_ = 0;
      uStack_40._4_4_ = 0;
      size = 0;
      uStack_50._0_1_ = 0;
      uStack_50._1_3_ = 0;
      uStack_50._4_4_ = 0;
      pAVar2 = obu_ctx->avx_ctx;
      if ((pAVar2 == (AvxInputContext *)0x0) || (*ppuVar1 == (uint8_t *)0x0)) {
        bVar4 = false;
        goto LAB_00123435;
      }
      sVar3 = obu_ctx->bytes_buffered;
      bytes_read_1 = 0;
      local_88 = 0;
      uVar11 = *psVar13;
      buffer_capacity = uVar11 - sVar3;
      local_78 = sVar9;
      if (buffer_capacity < 0x12) {
        if (uVar11 < 0x13) {
          uVar11 = 0x12;
        }
        iVar7 = obudec_grow_buffer(uVar11,ppuVar1,psVar13);
        sVar9 = bytes_read_1;
        if (iVar7 == 0) {
          uVar11 = *psVar13;
          if (uVar11 < 0x13) {
            uVar11 = 0x12;
          }
          buffer_capacity = buffer_capacity + uVar11;
          goto LAB_00123343;
        }
LAB_001233dc:
        bVar4 = false;
      }
      else {
LAB_00123343:
        psVar12 = &bytes_read_1;
        iVar7 = obudec_read_obu_header_and_size
                          (pAVar2,buffer_capacity,0,*ppuVar1 + sVar3,psVar12,&local_88,
                           (ObuHeader *)&size,false);
        buffered = SUB81(psVar12,0);
        sVar9 = local_78;
        if (iVar7 < 0) goto LAB_001233dc;
        if (CARRY8(bytes_read_1,local_88)) {
LAB_0012340f:
          bVar4 = false;
          sVar9 = local_78;
        }
        else if (local_88 < 0x10000001) {
          if (buffer_capacity < bytes_read_1 + local_88) {
            sVar9 = local_88;
            if (local_88 < *psVar13) {
              sVar9 = *psVar13;
            }
            iVar7 = obudec_grow_buffer(sVar9,ppuVar1,psVar13);
            if (iVar7 != 0) {
              sVar9 = local_88 + bytes_read_1;
              bVar4 = false;
              goto LAB_00123435;
            }
          }
          if ((local_88 != 0) &&
             (iVar7 = obudec_read_obu_payload
                                (pAVar2,local_88,*ppuVar1 + bytes_read_1 + sVar3,&bytes_read_1,
                                 (_Bool)buffered), iVar7 != 0)) goto LAB_0012340f;
          bVar4 = true;
          sVar9 = bytes_read_1;
        }
        else {
          bVar4 = false;
          fprintf(_stderr,"obudec: Read invalid OBU size (%u)\n",local_88 & 0xffffffff);
          sVar9 = local_88 + bytes_read_1;
        }
      }
LAB_00123435:
      if (bVar4) {
        psVar12 = (size_t *)obu_ctx->bytes_buffered;
        iVar7 = 3;
        if (((OBU_TYPE)uStack_50 != OBU_TEMPORAL_DELIMITER) && (sVar9 != 0)) {
          obu_ctx->bytes_buffered = (long)psVar12 + sVar9;
          iVar7 = 0;
          psVar12 = local_98;
        }
      }
      else {
        obudec_read_temporal_unit_cold_4();
        iVar7 = 1;
        psVar12 = local_98;
      }
      local_98 = psVar12;
    } while (iVar7 == 0);
    if (iVar7 != 3) {
      return -1;
    }
    goto LAB_00123554;
  }
  size = 0;
  if (obu_ctx->bytes_buffered == 0) {
    value = &size;
    iVar6 = obudec_read_leb128(obu_ctx->avx_ctx,tuheader,&length_of_temporal_unit_size,value,false);
    if (iVar6 != 0) {
      obudec_read_temporal_unit_cold_2();
      goto LAB_0012352d;
    }
    if ((size != 0) || (_Var5 = input_eof(obu_ctx->avx_ctx), !_Var5)) goto LAB_00123503;
    iVar7 = 1;
LAB_00123533:
    bVar4 = false;
  }
  else {
    value = &length_of_temporal_unit_size;
    iVar6 = aom_uleb_decode(obu_ctx->buffer,obu_ctx->bytes_buffered,&size,value);
    if (iVar6 != 0) {
      obudec_read_temporal_unit_cold_1();
LAB_0012352d:
      iVar7 = -1;
      goto LAB_00123533;
    }
LAB_00123503:
    value = (uint64_t *)size;
    if ((size >> 0x20 != 0) ||
       (value = (uint64_t *)(size + length_of_temporal_unit_size), (ulong)value >> 0x20 != 0)) {
      obudec_read_temporal_unit_cold_3();
      goto LAB_0012352d;
    }
    bVar4 = true;
    size = (uint64_t)value;
  }
  if (!bVar4) {
    return iVar7;
  }
  sVar9 = 0;
  local_98 = value;
LAB_00123554:
  ppuVar1 = local_80;
  if ((size_t *)0x200000000 < local_98) {
    obudec_read_temporal_unit_cold_7();
    return -1;
  }
  if (local_98 != (size_t *)0x0) {
    puVar8 = (uint8_t *)realloc(*local_80,(size_t)local_98);
    if (puVar8 == (uint8_t *)0x0) {
      obudec_read_temporal_unit_cold_5();
      return -1;
    }
    *ppuVar1 = puVar8;
  }
  *local_70 = (size_t)local_98;
  *local_68 = (size_t)local_98;
  if (obu_ctx->is_annexb == 0) {
    memcpy(*local_80,obu_ctx->buffer,(size_t)local_98);
    memmove(obu_ctx->buffer,obu_ctx->buffer + obu_ctx->bytes_buffered,sVar9);
    obu_ctx->bytes_buffered = sVar9;
  }
  else {
    _Var5 = input_eof(obu_ctx->avx_ctx);
    ppuVar1 = local_80;
    psVar12 = (size_t *)length_of_temporal_unit_size;
    psVar13 = local_98;
    if (!_Var5) {
      psVar10 = (size_t *)obu_ctx->bytes_buffered;
      if (psVar10 == (size_t *)0x0) {
        memcpy(*local_80,tuheader,length_of_temporal_unit_size);
        psVar10 = (size_t *)length_of_temporal_unit_size;
        psVar13 = local_98;
      }
      else {
        psVar12 = psVar10;
        if (local_98 <= psVar10) {
          psVar12 = local_98;
        }
        memcpy(*local_80,obu_ctx->buffer,(size_t)psVar12);
        obu_ctx->bytes_buffered = obu_ctx->bytes_buffered - (long)psVar12;
        psVar10 = psVar12;
      }
      sVar9 = read_from_input(obu_ctx->avx_ctx,(long)psVar13 - (long)psVar12,
                              (uchar *)((long)psVar10 + (long)*ppuVar1));
      if (sVar9 != (long)psVar13 - (long)psVar12) {
        obudec_read_temporal_unit_cold_6();
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

int obudec_read_temporal_unit(struct ObuDecInputContext *obu_ctx,
                              uint8_t **buffer, size_t *bytes_read,
                              size_t *buffer_size) {
  FILE *f = obu_ctx->avx_ctx->file;
  if (!f) return -1;

  *buffer_size = 0;
  *bytes_read = 0;

  if (input_eof(obu_ctx->avx_ctx)) {
    return 1;
  }

  size_t tu_size;
  size_t obu_size = 0;
  size_t length_of_temporal_unit_size = 0;
  uint8_t tuheader[OBU_MAX_LENGTH_FIELD_SIZE] = { 0 };

  if (obu_ctx->is_annexb) {
    uint64_t size = 0;

    if (obu_ctx->bytes_buffered == 0) {
      if (obudec_read_leb128(obu_ctx->avx_ctx, &tuheader[0],
                             &length_of_temporal_unit_size, &size,
                             /*buffered=*/false) != 0) {
        fprintf(stderr, "obudec: Failure reading temporal unit header\n");
        return -1;
      }
      if (size == 0 && input_eof(obu_ctx->avx_ctx)) {
        return 1;
      }
    } else {
      // temporal unit size was already stored in buffer
      if (aom_uleb_decode(obu_ctx->buffer, obu_ctx->bytes_buffered, &size,
                          &length_of_temporal_unit_size) != 0) {
        fprintf(stderr, "obudec: Failure reading temporal unit header\n");
        return -1;
      }
    }

    if (size > UINT32_MAX || size + length_of_temporal_unit_size > UINT32_MAX) {
      fprintf(stderr, "obudec: TU too large.\n");
      return -1;
    }

    size += length_of_temporal_unit_size;
    tu_size = (size_t)size;
  } else {
    while (1) {
      ObuHeader obu_header;
      memset(&obu_header, 0, sizeof(obu_header));

      if (obudec_read_one_obu(obu_ctx->avx_ctx, &obu_ctx->buffer,
                              obu_ctx->bytes_buffered,
                              &obu_ctx->buffer_capacity, &obu_size, &obu_header,
                              0, /*buffered=*/false) != 0) {
        fprintf(stderr, "obudec: read_one_obu failed in TU loop\n");
        return -1;
      }

      if (obu_header.type == OBU_TEMPORAL_DELIMITER || obu_size == 0) {
        tu_size = obu_ctx->bytes_buffered;
        break;
      } else {
        obu_ctx->bytes_buffered += obu_size;
      }
    }
  }

#if defined AOM_MAX_ALLOCABLE_MEMORY
  if (tu_size > AOM_MAX_ALLOCABLE_MEMORY) {
    fprintf(stderr, "obudec: Temporal Unit size exceeds max alloc size.\n");
    return -1;
  }
#endif
  if (tu_size > 0) {
    uint8_t *new_buffer = (uint8_t *)realloc(*buffer, tu_size);
    if (!new_buffer) {
      free(*buffer);
      fprintf(stderr, "obudec: Out of memory.\n");
      return -1;
    }
    *buffer = new_buffer;
  }
  *bytes_read = tu_size;
  *buffer_size = tu_size;

  if (!obu_ctx->is_annexb) {
    memcpy(*buffer, obu_ctx->buffer, tu_size);

    // At this point, (obu_ctx->buffer + obu_ctx->bytes_buffered + obu_size)
    // points to the end of the buffer.
    memmove(obu_ctx->buffer, obu_ctx->buffer + obu_ctx->bytes_buffered,
            obu_size);
    obu_ctx->bytes_buffered = obu_size;
  } else {
    if (!input_eof(obu_ctx->avx_ctx)) {
      size_t data_size;
      size_t offset;
      if (!obu_ctx->bytes_buffered) {
        data_size = tu_size - length_of_temporal_unit_size;
        memcpy(*buffer, &tuheader[0], length_of_temporal_unit_size);
        offset = length_of_temporal_unit_size;
      } else {
        const size_t copy_size = AOMMIN(obu_ctx->bytes_buffered, tu_size);
        memcpy(*buffer, obu_ctx->buffer, copy_size);
        offset = copy_size;
        data_size = tu_size - copy_size;
        obu_ctx->bytes_buffered -= copy_size;
      }

      if (read_from_input(obu_ctx->avx_ctx, data_size, *buffer + offset) !=
          data_size) {
        fprintf(stderr, "obudec: Failed to read full temporal unit\n");
        return -1;
      }
    }
  }
  return 0;
}